

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprFunction(Parse *pParse,ExprList *pList,Token *pToken)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Expr *pNew;
  Token *pToken_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)sqlite3ExprAlloc(db_00,0x97,pToken,1);
  if (pParse_local == (Parse *)0x0) {
    sqlite3ExprListDelete(db_00,pList);
    pParse_local = (Parse *)0x0;
  }
  else {
    ((anon_union_8_2_a01b6dbf_for_x *)&pParse_local->nTempInUse)->pList = pList;
    sqlite3ExprSetHeight(pParse,(Expr *)pParse_local);
  }
  return (Expr *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprFunction(Parse *pParse, ExprList *pList, Token *pToken){
  Expr *pNew;
  sqlite3 *db = pParse->db;
  assert( pToken );
  pNew = sqlite3ExprAlloc(db, TK_FUNCTION, pToken, 1);
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList); /* Avoid memory leak when malloc fails */
    return 0;
  }
  pNew->x.pList = pList;
  assert( !ExprHasProperty(pNew, EP_xIsSelect) );
  sqlite3ExprSetHeight(pParse, pNew);
  return pNew;
}